

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O2

size_t VW_HashFeatureStaticA(char *s,unsigned_long u,char *h,uint num_bits)

{
  uint64_t uVar1;
  string hash;
  string str;
  allocator local_99;
  allocator local_98 [32];
  string local_78;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,s,local_98);
  std::__cxx11::string::string((string *)local_98,h,&local_99);
  std::__cxx11::string::string((string *)&local_58,local_38);
  std::__cxx11::string::string((string *)&local_78,(string *)local_98);
  uVar1 = VW::hash_feature_static(&local_58,u,&local_78,num_bits);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_38);
  return uVar1;
}

Assistant:

VW_DLL_MEMBER size_t VW_CALLING_CONV VW_HashFeatureStaticA(const char * s, unsigned long u, const char * h = "strings", unsigned int num_bits = 18)
{ string str(s);
  string hash(h);
  return VW::hash_feature_static(str, u, hash, num_bits);
}